

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_ops_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::anon_unknown_0::ReflectionOpsTest_GenericSwap_Test::TestBody
          (ReflectionOpsTest_GenericSwap_Test *this)

{
  TestAllTypes *pTVar1;
  pointer *__ptr;
  char *pcVar2;
  AssertionResult gtest_ar;
  uint64_t initial_arena_size;
  Arena arena;
  TestAllTypes message;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_418;
  AssertHelper local_410;
  internal local_408 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_400;
  uint64_t local_3f8;
  ThreadSafeArena local_3f0;
  TestAllTypes local_348;
  
  ThreadSafeArena::ThreadSafeArena(&local_3f0);
  proto2_unittest::TestAllTypes::TestAllTypes(&local_348,(Arena *)0x0);
  pTVar1 = (TestAllTypes *)
           Arena::DefaultConstruct<proto2_unittest::TestAllTypes>((Arena *)&local_3f0);
  TestUtil::SetAllFields<proto2_unittest::TestAllTypes>(pTVar1);
  local_3f8 = ThreadSafeArena::SpaceUsed(&local_3f0);
  GenericSwap(&local_348.super_Message,(Message *)pTVar1);
  TestUtil::ExpectAllFieldsSet<proto2_unittest::TestAllTypes>(&local_348);
  TestUtil::ExpectClear<proto2_unittest::TestAllTypes>(pTVar1);
  local_418._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ThreadSafeArena::SpaceUsed(&local_3f0);
  testing::internal::CmpHelperGT<unsigned_long,unsigned_long>
            (local_408,"arena.SpaceUsed()","initial_arena_size",(unsigned_long *)&local_418,
             &local_3f8);
  if (local_408[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_418);
    if (local_400 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar2 = (local_400->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_410,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_ops_unittest.cc"
               ,0x1fe,pcVar2);
    testing::internal::AssertHelper::operator=(&local_410,(Message *)&local_418);
    testing::internal::AssertHelper::~AssertHelper(&local_410);
    if (local_418._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_418._M_head_impl + 8))();
    }
  }
  if (local_400 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_400,local_400);
  }
  proto2_unittest::TestAllTypes::~TestAllTypes(&local_348);
  proto2_unittest::TestAllTypes::TestAllTypes(&local_348,(Arena *)0x0);
  pTVar1 = (TestAllTypes *)
           Arena::DefaultConstruct<proto2_unittest::TestAllTypes>((Arena *)&local_3f0);
  TestUtil::SetAllFields<proto2_unittest::TestAllTypes>(pTVar1);
  local_3f8 = ThreadSafeArena::SpaceUsed(&local_3f0);
  GenericSwap((Message *)pTVar1,&local_348.super_Message);
  TestUtil::ExpectAllFieldsSet<proto2_unittest::TestAllTypes>(&local_348);
  TestUtil::ExpectClear<proto2_unittest::TestAllTypes>(pTVar1);
  local_418._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ThreadSafeArena::SpaceUsed(&local_3f0);
  testing::internal::CmpHelperGT<unsigned_long,unsigned_long>
            (local_408,"arena.SpaceUsed()","initial_arena_size",(unsigned_long *)&local_418,
             &local_3f8);
  if (local_408[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_418);
    if (local_400 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar2 = (local_400->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_410,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_ops_unittest.cc"
               ,0x20b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_410,(Message *)&local_418);
    testing::internal::AssertHelper::~AssertHelper(&local_410);
    if (local_418._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_418._M_head_impl + 8))();
    }
  }
  if (local_400 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_400,local_400);
  }
  proto2_unittest::TestAllTypes::~TestAllTypes(&local_348);
  ThreadSafeArena::~ThreadSafeArena(&local_3f0);
  return;
}

Assistant:

TEST(ReflectionOpsTest, GenericSwap) {
  Arena arena;
  {
    unittest::TestAllTypes message;
    auto* arena_message = Arena::Create<unittest::TestAllTypes>(&arena);
    TestUtil::SetAllFields(arena_message);
    const uint64_t initial_arena_size = arena.SpaceUsed();

    GenericSwap(&message, arena_message);

    TestUtil::ExpectAllFieldsSet(message);
    TestUtil::ExpectClear(*arena_message);
    // The temp should be allocated on the arena in this case.
    EXPECT_GT(arena.SpaceUsed(), initial_arena_size);
  }
  {
    unittest::TestAllTypes message;
    auto* arena_message = Arena::Create<unittest::TestAllTypes>(&arena);
    TestUtil::SetAllFields(arena_message);
    const uint64_t initial_arena_size = arena.SpaceUsed();

    GenericSwap(arena_message, &message);

    TestUtil::ExpectAllFieldsSet(message);
    TestUtil::ExpectClear(*arena_message);
    // The temp should be allocated on the arena in this case.
    EXPECT_GT(arena.SpaceUsed(), initial_arena_size);
  }
}